

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

void __thiscall Qentem::String<char>::Write(String<char> *this,char *str,SizeT len)

{
  uint size;
  char *from;
  char *to;
  
  if (len != 0 && str != (char *)0x0) {
    size = this->length_;
    from = this->storage_;
    to = allocate(this,size + 1 + len);
    Memory::Copy<unsigned_int>(to + size,str,len);
    to[size + len] = '\0';
    this->length_ = size + len;
    if (from != (char *)0x0) {
      Memory::Copy<unsigned_int>(to,from,size);
      MemoryRecord::RemoveAllocation(from);
      operator_delete(from);
      return;
    }
  }
  return;
}

Assistant:

void Write(const Char_T *str, const SizeT len) {
        if ((str != nullptr) && (len != 0)) {
            constexpr SizeT32 size    = sizeof(Char_T);
            const SizeT       src_len = Length();
            SizeT             new_len = (src_len + len + SizeT{1});
            Char_T           *src     = Storage();
            Char_T           *ns      = allocate(new_len);

            Memory::Copy((ns + src_len), str, (len * size));
            --new_len;
            ns[new_len] = Char_T{0};
            setLength(new_len);

            if (src != nullptr) {
                Memory::Copy(ns, src, (src_len * size));
                Memory::Deallocate(src);
            }
        }
    }